

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int sqlite3FixExprList(DbFixer *pFix,ExprList *pList)

{
  int iVar1;
  ExprList_item *local_30;
  ExprList_item *pItem;
  int i;
  ExprList *pList_local;
  DbFixer *pFix_local;
  
  if (pList != (ExprList *)0x0) {
    local_30 = pList->a;
    for (pItem._4_4_ = 0; pItem._4_4_ < pList->nExpr; pItem._4_4_ = pItem._4_4_ + 1) {
      iVar1 = sqlite3FixExpr(pFix,local_30->pExpr);
      if (iVar1 != 0) {
        return 1;
      }
      local_30 = local_30 + 1;
    }
  }
  return 0;
}

Assistant:

SQLITE_PRIVATE int sqlite3FixExprList(
  DbFixer *pFix,     /* Context of the fixation */
  ExprList *pList    /* The expression to be fixed to one database */
){
  int i;
  struct ExprList_item *pItem;
  if( pList==0 ) return 0;
  for(i=0, pItem=pList->a; i<pList->nExpr; i++, pItem++){
    if( sqlite3FixExpr(pFix, pItem->pExpr) ){
      return 1;
    }
  }
  return 0;
}